

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O1

void amrex::average_down_nodal<amrex::IArrayBox>
               (FabArray<amrex::IArrayBox> *fine,FabArray<amrex::IArrayBox> *crse,IntVect *ratio,
               int ngcrse,bool mfiter_is_definitely_safe)

{
  DistributionMapping *this;
  uint nvar;
  int iVar1;
  int iVar2;
  int iVar3;
  FabArray<amrex::IArrayBox> *pFVar4;
  FabArray<amrex::IArrayBox> *pFVar5;
  bool bVar6;
  Periodicity *period;
  int iVar7;
  int iVar8;
  undefined7 in_register_00000081;
  ulong local_308;
  Box local_2e4;
  IntVect *local_2c8;
  FabArray<amrex::IArrayBox> *local_2c0;
  FabArray<amrex::IArrayBox> *local_2b8;
  long local_2b0;
  long local_2a8;
  ulong local_2a0;
  long local_298;
  long local_290;
  long local_280;
  long local_278;
  long local_270;
  undefined1 local_268 [24];
  pointer pbStack_250;
  undefined8 local_248;
  int local_240;
  FabFactory<amrex::IArrayBox> local_220;
  BoxArray local_218;
  MFIter mfi;
  
  nvar = (crse->super_FabArrayBase).n_comp;
  if ((int)CONCAT71(in_register_00000081,mfiter_is_definitely_safe) == 0) {
    this = &(fine->super_FabArrayBase).distributionMap;
    bVar6 = DistributionMapping::operator==(this,&(crse->super_FabArrayBase).distributionMap);
    if ((!bVar6) ||
       ((fine->super_FabArrayBase).boxarray.m_ref.
        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (crse->super_FabArrayBase).boxarray.m_ref.
        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
      coarsen(&local_218,&(fine->super_FabArrayBase).boxarray,ratio);
      local_268._0_8_ = (int *)0x1;
      local_268._8_8_ = (Arena *)0x0;
      local_268._16_8_ = (pointer)0x0;
      pbStack_250 = (pointer)0x0;
      local_248 = (pointer)0x0;
      local_220._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0074f4c0;
      local_2e4.smallend.vect[0] = ngcrse;
      local_2e4.smallend.vect[1] = ngcrse;
      local_2e4.smallend.vect[2] = ngcrse;
      FabArray<amrex::IArrayBox>::FabArray
                ((FabArray<amrex::IArrayBox> *)&mfi,&local_218,this,nvar,&local_2e4.smallend,
                 (MFInfo *)local_268,&local_220);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_268 + 0x10));
      BoxArray::~BoxArray(&local_218);
      average_down_nodal<amrex::IArrayBox>
                (fine,(FabArray<amrex::IArrayBox> *)&mfi,ratio,ngcrse,false);
      period = Periodicity::NonPeriodic();
      local_268._4_4_ = ngcrse;
      local_268._0_4_ = ngcrse;
      local_268._8_4_ = ngcrse;
      local_218.m_bat.m_bat_type = ngcrse;
      local_218.m_bat.m_op.m_indexType.m_typ.itype = (BATindexType)ngcrse;
      local_218.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)ngcrse;
      FabArray<amrex::IArrayBox>::ParallelCopy_nowait
                (crse,(FabArray<amrex::IArrayBox> *)&mfi,0,0,nvar,(IntVect *)&local_218,
                 (IntVect *)local_268,period,COPY,(CPC *)0x0,false);
      FabArray<amrex::IArrayBox>::~FabArray((FabArray<amrex::IArrayBox> *)&mfi);
      return;
    }
  }
  local_2c8 = ratio;
  MFIter::MFIter(&mfi,&crse->super_FabArrayBase,true);
  pFVar4 = fine;
  pFVar5 = crse;
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      local_2b8 = pFVar5;
      local_2c0 = pFVar4;
      pFVar5 = local_2b8;
      pFVar4 = local_2c0;
      MFIter::growntilebox(&local_2e4,&mfi,ngcrse);
      FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>((Array4<int> *)&local_218,pFVar5,&mfi);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)local_268,pFVar4,&mfi);
      if (0 < (int)nvar) {
        iVar1 = local_2c8->vect[0];
        local_2a8 = (long)local_2c8->vect[1];
        local_2b0 = (long)local_2c8->vect[2];
        local_2a0 = (ulong)(uint)local_2e4.bigend.vect[0];
        local_308 = 0;
        do {
          iVar2 = local_2e4.smallend.vect[2];
          if (local_2e4.smallend.vect[2] <= local_2e4.bigend.vect[2]) {
            do {
              if (local_2e4.smallend.vect[1] <= local_2e4.bigend.vect[1]) {
                local_280 = (long)iVar2;
                local_290 = (long)pbStack_250 * local_308;
                local_298 = local_218.m_bat.m_op._20_8_ * local_308;
                iVar3 = local_2e4.smallend.vect[1];
                do {
                  if (local_2e4.smallend.vect[0] <= local_2e4.bigend.vect[0]) {
                    local_270 = (long)iVar3;
                    local_278 = local_270 * local_2a8;
                    iVar7 = local_2e4.smallend.vect[0] * iVar1;
                    iVar8 = local_2e4.smallend.vect[0];
                    do {
                      *(int *)(CONCAT44(local_218.m_bat.m_op.m_indexType.m_typ.itype,
                                        local_218.m_bat.m_bat_type) +
                               (local_270 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                               CONCAT44(local_218.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0],
                                        local_218.m_bat.m_op.m_bndryReg.m_typ.itype) * 4 +
                               (long)(iVar8 - local_218.m_bat.m_op._28_4_) * 4 +
                               (local_280 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                               local_218.m_bat.m_op._12_8_ * 4 + local_298 * 4) =
                           *(int *)(local_268._0_8_ +
                                   ((local_278 - local_248._4_4_) * local_268._8_8_ +
                                   (long)(iVar7 - (int)local_248) +
                                   (local_280 * local_2b0 - (long)local_240) * local_268._16_8_ +
                                   local_290) * 4);
                      iVar8 = iVar8 + 1;
                      iVar7 = iVar7 + iVar1;
                    } while (local_2e4.bigend.vect[0] + 1U != iVar8);
                  }
                  bVar6 = iVar3 != local_2e4.bigend.vect[1];
                  iVar3 = iVar3 + 1;
                } while (bVar6);
              }
              bVar6 = iVar2 != local_2e4.bigend.vect[2];
              iVar2 = iVar2 + 1;
            } while (bVar6);
          }
          local_308 = local_308 + 1;
        } while (local_308 != nvar);
      }
      MFIter::operator++(&mfi);
      pFVar4 = local_2c0;
      pFVar5 = local_2b8;
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void average_down_nodal (const FabArray<FAB>& fine, FabArray<FAB>& crse,
                         const IntVect& ratio, int ngcrse, bool mfiter_is_definitely_safe)
{
    AMREX_ASSERT(fine.is_nodal());
    AMREX_ASSERT(crse.is_nodal());
    AMREX_ASSERT(crse.nComp() == fine.nComp());

    int ncomp = crse.nComp();
    using value_type = typename FAB::value_type;

    if (mfiter_is_definitely_safe || isMFIterSafe(fine, crse))
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(ngcrse);
            Array4<value_type> const& crsearr = crse.array(mfi);
            Array4<value_type const> const& finearr = fine.const_array(mfi);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                amrex_avgdown_nodes(tbx,crsearr,finearr,0,0,ncomp,ratio);
            });
        }
    }
    else
    {
        FabArray<FAB> ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                           ncomp, ngcrse);
        average_down_nodal(fine, ctmp, ratio, ngcrse);
        crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
    }
}